

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O3

libcaption_stauts_t sei_from_caption_clear(sei_t *sei)

{
  uint16_t uVar1;
  cea708_t cea708;
  cea708_t local_b0;
  
  cea708_init(&local_b0,sei->timestamp);
  uVar1 = eia608_control_command(eia608_control_end_of_caption,0);
  cea708_add_cc_data(&local_b0,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(eia608_control_end_of_caption,0);
  cea708_add_cc_data(&local_b0,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(eia608_control_erase_non_displayed_memory,0);
  cea708_add_cc_data(&local_b0,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(eia608_control_erase_non_displayed_memory,0);
  cea708_add_cc_data(&local_b0,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(eia608_control_erase_display_memory,0);
  cea708_add_cc_data(&local_b0,1,cc_type_ntsc_cc_field_1,uVar1);
  uVar1 = eia608_control_command(eia608_control_erase_display_memory,0);
  cea708_add_cc_data(&local_b0,1,cc_type_ntsc_cc_field_1,uVar1);
  sei_append_708(sei,&local_b0);
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t sei_from_caption_clear(sei_t* sei)
{
    cea708_t cea708;
    cea708_init(&cea708, sei->timestamp); // set up a new popon frame
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_end_of_caption, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_non_displayed_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_non_displayed_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_display_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_display_memory, DEFAULT_CHANNEL));
    sei_append_708(sei, &cea708);
    return LIBCAPTION_OK;
}